

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O2

void amrex::Divide<amrex::IArrayBox,void>
               (FabArray<amrex::IArrayBox> *dst,FabArray<amrex::IArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int j;
  int iVar7;
  Box local_1ac;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  FabArray<amrex::IArrayBox> *local_178;
  FabArray<amrex::IArrayBox> *local_170;
  IntVect *local_168;
  long local_160;
  long local_158;
  ulong local_150;
  long local_148;
  long local_140;
  ulong local_138;
  ulong local_130;
  Array4<int> dstFab;
  Array4<const_int> srcFab;
  MFIter mfi;
  
  uVar4 = (ulong)(uint)numcomp;
  local_178 = dst;
  local_170 = src;
  local_168 = nghost;
  MFIter::MFIter(&mfi,&dst->super_FabArrayBase,true);
  local_158 = (long)dstcomp;
  if (numcomp < 1) {
    uVar4 = 0;
  }
  local_160 = (long)srccomp;
  local_150 = uVar4;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_1ac,&mfi,local_168);
    if ((((local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) &&
         (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1])) &&
        (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2])) && (local_1ac.btype.itype < 8)) {
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(&srcFab,local_170,&mfi);
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(&dstFab,local_178,&mfi);
      local_180 = local_1ac.smallend.vect[0];
      local_18c = local_1ac.smallend.vect[1];
      local_190 = local_1ac.smallend.vect[2];
      local_130 = (ulong)(uint)local_1ac.bigend.vect[0];
      local_17c = local_1ac.bigend.vect[1];
      local_188 = local_1ac.bigend.vect[2];
      uVar4 = 0;
      while (uVar3 = uVar4, uVar3 != local_150) {
        local_140 = local_160 + uVar3;
        local_148 = local_158 + uVar3;
        iVar7 = local_1ac.smallend.vect[2];
        while (iVar1 = iVar7, iVar1 <= local_1ac.bigend.vect[2]) {
          for (iVar7 = local_1ac.smallend.vect[1]; iVar7 <= local_1ac.bigend.vect[1];
              iVar7 = iVar7 + 1) {
            iVar2 = local_1ac.smallend.vect[0];
            if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
              do {
                lVar6 = ((long)iVar7 - (long)dstFab.begin.y) * dstFab.jstride;
                lVar5 = ((long)iVar1 - (long)dstFab.begin.z) * dstFab.kstride;
                dstFab.p[lVar6 + (long)(iVar2 - dstFab.begin.x) + lVar5 + dstFab.nstride * local_148
                        ] = dstFab.p[lVar6 + (long)(iVar2 - dstFab.begin.x) +
                                             lVar5 + dstFab.nstride * local_148] /
                            srcFab.p[((long)iVar7 - (long)srcFab.begin.y) * srcFab.jstride +
                                     (long)(iVar2 - srcFab.begin.x) +
                                     ((long)iVar1 - (long)srcFab.begin.z) * srcFab.kstride +
                                     srcFab.nstride * local_140];
                iVar2 = iVar2 + 1;
              } while (local_1ac.bigend.vect[0] + 1U != iVar2);
            }
          }
          local_184 = iVar1;
          iVar7 = iVar1 + 1;
        }
        local_138 = uVar3;
        uVar4 = uVar3 + 1;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Divide (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) /= srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) /= srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}